

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O3

void occ_doit(void)

{
  occurrence_granular q;
  occurrence_granular local_10;
  
  printf("event_id,period_no,occ_year,occ_month,occ_day");
  if (granular_date_ == 0) {
    putchar(10);
    occ_doit<occurrence>((occurrence *)&local_10);
  }
  else {
    puts(",occ_hour,occ_minute");
    occ_doit<occurrence_granular>(&local_10);
  }
  return;
}

Assistant:

void occ_doit()
{

	printf("event_id,period_no,occ_year,occ_month,occ_day");
	if (granular_date_) {
		printf(",occ_hour,occ_minute\n");
		occurrence_granular q;
		occ_doit(q);
	} else {
		printf("\n");
		occurrence q;
		occ_doit(q);
	}

}